

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  _func_int **pp_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint uVar25;
  float *pfVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  float *pfVar34;
  uint uVar35;
  undefined1 (*pauVar36) [32];
  uint uVar37;
  float *pfVar38;
  uint uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [28];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar60 [16];
  undefined1 auVar64 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  auVar24 = _DAT_005950e0;
  auVar23 = _DAT_005950c0;
  auVar43 = in_ZMM3._0_16_;
  iVar1 = bottom_top_blob->elempack;
  iVar27 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar25 = bottom_top_blob->h;
  iVar3 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar27 == 2) {
    if (0 < (int)uVar25) {
      uVar35 = iVar1 * iVar2;
      pp_Var5 = this->_vptr_BatchNorm_x86_avx;
      uVar40 = 0;
      auVar41._8_8_ = 0x8000000000000000;
      auVar41._0_8_ = 0x8000000000000000;
      auVar43 = vpcmpeqd_avx(auVar43,auVar43);
      do {
        lVar31 = *(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]);
        uVar39 = *(uint *)(lVar31 + uVar40 * 4);
        if (iVar1 == 4) {
          auVar44 = *(undefined1 (*) [16])(lVar31 + uVar40 * 0x10);
        }
        else {
          auVar44 = vshufps_avx(ZEXT416(uVar39),ZEXT416(uVar39),0);
        }
        lVar6 = *(long *)(&this->field_0x240 + (long)pp_Var5[-3]);
        uVar30 = *(uint *)(lVar6 + uVar40 * 4);
        if (iVar1 == 4) {
          auVar42 = *(undefined1 (*) [16])(lVar6 + uVar40 * 0x10);
        }
        else {
          auVar42 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
        }
        if (iVar1 == 8) {
          auVar46 = *(undefined1 (*) [32])(lVar31 + uVar40 * 0x20);
          auVar52 = SUB3228(*(undefined1 (*) [32])(lVar6 + uVar40 * 0x20),0);
        }
        else {
          auVar46._16_16_ = auVar44;
          auVar46._0_16_ = auVar44;
          auVar53._16_16_ = auVar42;
          auVar53._0_16_ = auVar42;
          auVar52 = auVar53._0_28_;
        }
        pauVar36 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar40 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar28 = 0;
        if (7 < (int)uVar35) {
          iVar29 = 7;
          do {
            auVar61._0_4_ = auVar52._0_4_ * *(float *)*pauVar36 + auVar46._0_4_;
            auVar61._4_4_ = auVar52._4_4_ * *(float *)((long)*pauVar36 + 4) + auVar46._4_4_;
            auVar61._8_4_ = auVar52._8_4_ * *(float *)((long)*pauVar36 + 8) + auVar46._8_4_;
            auVar61._12_4_ = auVar52._12_4_ * *(float *)((long)*pauVar36 + 0xc) + auVar46._12_4_;
            auVar61._16_4_ = auVar52._16_4_ * *(float *)((long)*pauVar36 + 0x10) + auVar46._16_4_;
            auVar61._20_4_ = auVar52._20_4_ * *(float *)((long)*pauVar36 + 0x14) + auVar46._20_4_;
            auVar61._24_4_ = auVar52._24_4_ * *(float *)((long)*pauVar36 + 0x18) + auVar46._24_4_;
            auVar61._28_4_ = in_ZMM10._28_4_ + auVar46._28_4_;
            in_ZMM10 = ZEXT3264(auVar61);
            *pauVar36 = auVar61;
            pauVar36 = pauVar36 + 1;
            iVar29 = iVar29 + 8;
            uVar28 = uVar35 & 0xfffffff8;
          } while (iVar29 < (int)uVar35);
        }
        uVar37 = uVar28 | 3;
        while ((int)uVar37 < (int)uVar35) {
          fVar9 = *(float *)((long)*pauVar36 + 4);
          fVar10 = *(float *)((long)*pauVar36 + 8);
          fVar11 = *(float *)((long)*pauVar36 + 0xc);
          *(float *)*pauVar36 = auVar42._0_4_ * *(float *)*pauVar36 + auVar44._0_4_;
          *(float *)((long)*pauVar36 + 4) = auVar42._4_4_ * fVar9 + auVar44._4_4_;
          *(float *)((long)*pauVar36 + 8) = auVar42._8_4_ * fVar10 + auVar44._8_4_;
          *(float *)((long)*pauVar36 + 0xc) = auVar42._12_4_ * fVar11 + auVar44._12_4_;
          pauVar36 = (undefined1 (*) [32])((long)*pauVar36 + 0x10);
          uVar37 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        if ((int)uVar28 < (int)uVar35) {
          uVar32 = CONCAT44(0,~uVar28 + uVar35);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar32;
          auVar45 = vpshufd_avx(auVar44,0x44);
          auVar7 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
          auVar8 = vshufps_avx(ZEXT416(uVar39),ZEXT416(uVar39),0);
          auVar44 = vorps_avx(auVar45,auVar41);
          auVar42 = vorps_avx(auVar45,auVar41);
          uVar33 = 0;
          do {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar33;
            auVar48 = vpshufd_avx(auVar48,0x44);
            auVar54._16_16_ = auVar48;
            auVar54._0_16_ = auVar48;
            auVar46 = vorps_avx(auVar54,auVar23);
            auVar53 = vorps_avx(auVar54,auVar24);
            auVar48 = vorps_avx(auVar45,auVar41);
            auVar65._0_8_ = auVar53._16_8_ ^ 0x8000000000000000;
            auVar65._8_4_ = auVar53._24_4_;
            auVar65._12_4_ = auVar53._28_4_ ^ 0x80000000;
            auVar65 = vpcmpgtq_avx(auVar65,auVar48);
            auVar49._0_8_ = auVar53._0_8_ ^ 0x8000000000000000;
            auVar49._8_4_ = auVar53._8_4_;
            auVar49._12_4_ = auVar53._12_4_ ^ 0x80000000;
            auVar49 = vpcmpgtq_avx(auVar49,auVar44);
            auVar65 = vpackssdw_avx(auVar49,auVar65);
            auVar66._0_8_ = auVar46._16_8_ ^ 0x8000000000000000;
            auVar66._8_4_ = auVar46._24_4_;
            auVar66._12_4_ = auVar46._28_4_ ^ 0x80000000;
            auVar48 = vpcmpgtq_avx(auVar66,auVar48);
            auVar59._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
            auVar59._8_4_ = auVar46._8_4_;
            auVar59._12_4_ = auVar46._12_4_ ^ 0x80000000;
            auVar49 = vpcmpgtq_avx(auVar59,auVar42);
            auVar48 = vpackssdw_avx(auVar49,auVar48);
            auVar48 = vpackssdw_avx(auVar48 ^ auVar43,auVar65 ^ auVar43);
            auVar65 = vpmovsxwd_avx(auVar48);
            auVar48 = vpunpckhwd_avx(auVar48,auVar48);
            auVar55._16_16_ = auVar48;
            auVar55._0_16_ = auVar65;
            auVar46 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])((long)*pauVar36 + uVar33 * 4));
            auVar62._0_4_ = auVar46._0_4_ * auVar7._0_4_ + auVar8._0_4_;
            auVar62._4_4_ = auVar46._4_4_ * auVar7._4_4_ + auVar8._4_4_;
            auVar62._8_4_ = auVar46._8_4_ * auVar7._8_4_ + auVar8._8_4_;
            auVar62._12_4_ = auVar46._12_4_ * auVar7._12_4_ + auVar8._12_4_;
            auVar62._16_4_ = auVar46._16_4_ * auVar7._0_4_ + auVar8._0_4_;
            auVar62._20_4_ = auVar46._20_4_ * auVar7._4_4_ + auVar8._4_4_;
            auVar62._24_4_ = auVar46._24_4_ * auVar7._8_4_ + auVar8._8_4_;
            auVar62._28_4_ = auVar46._28_4_ + auVar8._12_4_;
            in_ZMM10 = ZEXT3264(auVar62);
            auVar46 = vmaskmovps_avx(auVar55,auVar62);
            *(undefined1 (*) [32])((long)*pauVar36 + uVar33 * 4) = auVar46;
            uVar33 = uVar33 + 8;
          } while ((uVar32 + 8 & 0x1fffffff8) != uVar33);
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 != uVar25);
    }
  }
  else if (iVar27 == 1) {
    pfVar34 = (float *)bottom_top_blob->data;
    pfVar26 = *(float **)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
    pfVar38 = *(float **)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
    uVar39 = iVar1 * iVar2;
    uVar35 = 0;
    if (7 < (int)uVar39) {
      uVar35 = uVar39 & 0x7ffffff8;
      iVar29 = 7;
      do {
        fVar9 = pfVar38[1];
        fVar10 = pfVar38[2];
        fVar11 = pfVar38[3];
        fVar12 = pfVar38[4];
        fVar13 = pfVar38[5];
        fVar14 = pfVar38[6];
        fVar15 = pfVar38[7];
        fVar16 = pfVar26[1];
        fVar17 = pfVar26[2];
        fVar18 = pfVar26[3];
        fVar19 = pfVar26[4];
        fVar20 = pfVar26[5];
        fVar21 = pfVar26[6];
        fVar22 = pfVar26[7];
        *pfVar34 = *pfVar38 * *pfVar34 + *pfVar26;
        pfVar34[1] = fVar9 * pfVar34[1] + fVar16;
        pfVar34[2] = fVar10 * pfVar34[2] + fVar17;
        pfVar34[3] = fVar11 * pfVar34[3] + fVar18;
        pfVar34[4] = fVar12 * pfVar34[4] + fVar19;
        pfVar34[5] = fVar13 * pfVar34[5] + fVar20;
        pfVar34[6] = fVar14 * pfVar34[6] + fVar21;
        pfVar34[7] = fVar15 + fVar22;
        pfVar34 = pfVar34 + 8;
        pfVar26 = pfVar26 + 8;
        pfVar38 = pfVar38 + 8;
        iVar29 = iVar29 + 8;
      } while (iVar29 < (int)uVar39);
    }
    uVar30 = uVar35 | 3;
    while ((int)uVar30 < (int)uVar39) {
      fVar9 = pfVar38[1];
      fVar10 = pfVar38[2];
      fVar11 = pfVar38[3];
      fVar12 = pfVar26[1];
      fVar13 = pfVar26[2];
      fVar14 = pfVar26[3];
      *pfVar34 = *pfVar38 * *pfVar34 + *pfVar26;
      pfVar34[1] = fVar9 * pfVar34[1] + fVar12;
      pfVar34[2] = fVar10 * pfVar34[2] + fVar13;
      pfVar34[3] = fVar11 * pfVar34[3] + fVar14;
      pfVar34 = pfVar34 + 4;
      pfVar26 = pfVar26 + 4;
      pfVar38 = pfVar38 + 4;
      uVar30 = uVar35 + 7;
      uVar35 = uVar35 + 4;
    }
    if (uVar39 - uVar35 != 0 && (int)uVar35 <= (int)uVar39) {
      lVar31 = 0;
      do {
        pfVar34[lVar31] = pfVar34[lVar31] * pfVar38[lVar31] + pfVar26[lVar31];
        lVar31 = lVar31 + 1;
      } while (uVar39 - uVar35 != (int)lVar31);
    }
  }
  auVar24 = _DAT_005950e0;
  auVar23 = _DAT_005950c0;
  if ((iVar27 - 3U < 2) && (0 < (int)uVar4)) {
    uVar25 = iVar2 * iVar1 * uVar25 * iVar3;
    pp_Var5 = this->_vptr_BatchNorm_x86_avx;
    uVar40 = 0;
    auVar42._8_8_ = 0x8000000000000000;
    auVar42._0_8_ = 0x8000000000000000;
    auVar43 = vpcmpeqd_avx(auVar43,auVar43);
    do {
      lVar31 = *(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]);
      uVar35 = *(uint *)(lVar31 + uVar40 * 4);
      if (iVar1 == 4) {
        auVar41 = *(undefined1 (*) [16])(lVar31 + uVar40 * 0x10);
      }
      else {
        auVar41 = vshufps_avx(ZEXT416(uVar35),ZEXT416(uVar35),0);
      }
      lVar6 = *(long *)(&this->field_0x240 + (long)pp_Var5[-3]);
      uVar39 = *(uint *)(lVar6 + uVar40 * 4);
      if (iVar1 == 4) {
        auVar44 = *(undefined1 (*) [16])(lVar6 + uVar40 * 0x10);
      }
      else {
        auVar44 = vshufps_avx(ZEXT416(uVar39),ZEXT416(uVar39),0);
      }
      if (iVar1 == 8) {
        auVar47 = *(undefined1 (*) [32])(lVar31 + uVar40 * 0x20);
        auVar52 = SUB3228(*(undefined1 (*) [32])(lVar6 + uVar40 * 0x20),0);
      }
      else {
        auVar47._16_16_ = auVar41;
        auVar47._0_16_ = auVar41;
        auVar56._16_16_ = auVar44;
        auVar56._0_16_ = auVar44;
        auVar52 = auVar56._0_28_;
      }
      pauVar36 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar40 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar30 = 0;
      if (7 < (int)uVar25) {
        iVar27 = 7;
        do {
          auVar63._0_4_ = auVar52._0_4_ * *(float *)*pauVar36 + auVar47._0_4_;
          auVar63._4_4_ = auVar52._4_4_ * *(float *)((long)*pauVar36 + 4) + auVar47._4_4_;
          auVar63._8_4_ = auVar52._8_4_ * *(float *)((long)*pauVar36 + 8) + auVar47._8_4_;
          auVar63._12_4_ = auVar52._12_4_ * *(float *)((long)*pauVar36 + 0xc) + auVar47._12_4_;
          auVar63._16_4_ = auVar52._16_4_ * *(float *)((long)*pauVar36 + 0x10) + auVar47._16_4_;
          auVar63._20_4_ = auVar52._20_4_ * *(float *)((long)*pauVar36 + 0x14) + auVar47._20_4_;
          auVar63._24_4_ = auVar52._24_4_ * *(float *)((long)*pauVar36 + 0x18) + auVar47._24_4_;
          auVar63._28_4_ = in_ZMM10._28_4_ + auVar47._28_4_;
          in_ZMM10 = ZEXT3264(auVar63);
          *pauVar36 = auVar63;
          pauVar36 = pauVar36 + 1;
          iVar27 = iVar27 + 8;
          uVar30 = uVar25 & 0xfffffff8;
        } while (iVar27 < (int)uVar25);
      }
      uVar28 = uVar30 | 3;
      while ((int)uVar28 < (int)uVar25) {
        fVar9 = *(float *)((long)*pauVar36 + 4);
        fVar10 = *(float *)((long)*pauVar36 + 8);
        fVar11 = *(float *)((long)*pauVar36 + 0xc);
        *(float *)*pauVar36 = auVar44._0_4_ * *(float *)*pauVar36 + auVar41._0_4_;
        *(float *)((long)*pauVar36 + 4) = auVar44._4_4_ * fVar9 + auVar41._4_4_;
        *(float *)((long)*pauVar36 + 8) = auVar44._8_4_ * fVar10 + auVar41._8_4_;
        *(float *)((long)*pauVar36 + 0xc) = auVar44._12_4_ * fVar11 + auVar41._12_4_;
        pauVar36 = (undefined1 (*) [32])((long)*pauVar36 + 0x10);
        uVar28 = uVar30 + 7;
        uVar30 = uVar30 + 4;
      }
      if ((int)uVar30 < (int)uVar25) {
        uVar32 = CONCAT44(0,~uVar30 + uVar25);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar32;
        auVar45 = vpshufd_avx(auVar45,0x44);
        auVar7 = vshufps_avx(ZEXT416(uVar39),ZEXT416(uVar39),0);
        auVar8 = vshufps_avx(ZEXT416(uVar35),ZEXT416(uVar35),0);
        auVar41 = vorps_avx(auVar45,auVar42);
        auVar44 = vorps_avx(auVar45,auVar42);
        uVar33 = 0;
        do {
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar33;
          auVar48 = vpshufd_avx(auVar50,0x44);
          auVar57._16_16_ = auVar48;
          auVar57._0_16_ = auVar48;
          auVar46 = vorps_avx(auVar57,auVar23);
          auVar53 = vorps_avx(auVar57,auVar24);
          auVar48 = vorps_avx(auVar45,auVar42);
          auVar67._0_8_ = auVar53._16_8_ ^ 0x8000000000000000;
          auVar67._8_4_ = auVar53._24_4_;
          auVar67._12_4_ = auVar53._28_4_ ^ 0x80000000;
          auVar65 = vpcmpgtq_avx(auVar67,auVar48);
          auVar51._0_8_ = auVar53._0_8_ ^ 0x8000000000000000;
          auVar51._8_4_ = auVar53._8_4_;
          auVar51._12_4_ = auVar53._12_4_ ^ 0x80000000;
          auVar49 = vpcmpgtq_avx(auVar51,auVar41);
          auVar65 = vpackssdw_avx(auVar49,auVar65);
          auVar68._0_8_ = auVar46._16_8_ ^ 0x8000000000000000;
          auVar68._8_4_ = auVar46._24_4_;
          auVar68._12_4_ = auVar46._28_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar68,auVar48);
          auVar60._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
          auVar60._8_4_ = auVar46._8_4_;
          auVar60._12_4_ = auVar46._12_4_ ^ 0x80000000;
          auVar49 = vpcmpgtq_avx(auVar60,auVar44);
          auVar48 = vpackssdw_avx(auVar49,auVar48);
          auVar48 = vpackssdw_avx(auVar48 ^ auVar43,auVar65 ^ auVar43);
          auVar65 = vpmovsxwd_avx(auVar48);
          auVar48 = vpunpckhwd_avx(auVar48,auVar48);
          auVar58._16_16_ = auVar48;
          auVar58._0_16_ = auVar65;
          auVar46 = vmaskmovps_avx(auVar58,*(undefined1 (*) [32])((long)*pauVar36 + uVar33 * 4));
          auVar64._0_4_ = auVar46._0_4_ * auVar7._0_4_ + auVar8._0_4_;
          auVar64._4_4_ = auVar46._4_4_ * auVar7._4_4_ + auVar8._4_4_;
          auVar64._8_4_ = auVar46._8_4_ * auVar7._8_4_ + auVar8._8_4_;
          auVar64._12_4_ = auVar46._12_4_ * auVar7._12_4_ + auVar8._12_4_;
          auVar64._16_4_ = auVar46._16_4_ * auVar7._0_4_ + auVar8._0_4_;
          auVar64._20_4_ = auVar46._20_4_ * auVar7._4_4_ + auVar8._4_4_;
          auVar64._24_4_ = auVar46._24_4_ * auVar7._8_4_ + auVar8._8_4_;
          auVar64._28_4_ = auVar46._28_4_ + auVar8._12_4_;
          in_ZMM10 = ZEXT3264(auVar64);
          auVar46 = vmaskmovps_avx(auVar58,auVar64);
          *(undefined1 (*) [32])((long)*pauVar36 + uVar33 * 4) = auVar46;
          uVar33 = uVar33 + 8;
        } while ((uVar32 + 8 & 0x1fffffff8) != uVar33);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != uVar4);
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}